

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimaleglscreen.cpp
# Opt level: O2

QRect __thiscall QMinimalEglScreen::geometry(QMinimalEglScreen *this)

{
  bool bVar1;
  
  bVar1 = QRect::isNull(&this->m_geometry);
  if (bVar1) {
    createAndSetPlatformContext(this);
  }
  return this->m_geometry;
}

Assistant:

QRect QMinimalEglScreen::geometry() const
{
    if (m_geometry.isNull()) {
        createAndSetPlatformContext();
    }
    return m_geometry;
}